

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

void google::protobuf::compiler::cpp::GenerateUtf8CheckCode
               (Printer *p,FieldDescriptor *field,Options *options,bool for_parse,string_view params
               ,string_view strict_function,string_view verify_function)

{
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  char cVar1;
  Type TVar2;
  FileOptions_OptimizeMode FVar3;
  FileDescriptor *file;
  Sub *local_3d0;
  basic_string_view<char,_std::char_traits<char>_> local_380;
  basic_string_view<char,_std::char_traits<char>_> local_368;
  basic_string_view<char,_std::char_traits<char>_> local_350;
  basic_string_view<char,_std::char_traits<char>_> local_338;
  undefined1 local_323;
  undefined1 local_322;
  allocator<char> local_321;
  undefined1 local_320 [5];
  bool is_lite;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2c1;
  string local_2c0;
  Sub *local_2a0;
  Sub local_298;
  Sub local_1e0;
  Sub local_128;
  iterator local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_60;
  undefined1 local_50 [8];
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v;
  bool for_parse_local;
  Options *options_local;
  FieldDescriptor *field_local;
  Printer *p_local;
  string_view params_local;
  
  params_local._M_len = (size_t)params._M_str;
  p_local = (Printer *)params._M_len;
  v.storage_.callback_buffer_[0xf] = for_parse;
  TVar2 = FieldDescriptor::type(field);
  if (TVar2 == TYPE_STRING) {
    local_322 = 1;
    local_2a0 = &local_298;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"params",&local_2c1);
    io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>&>
              (&local_298,&local_2c0,(basic_string_view<char,_std::char_traits<char>_> *)&p_local);
    local_2a0 = &local_1e0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"Strict",&local_2f9);
    io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>&>
              (&local_1e0,&local_2f8,&strict_function);
    local_2a0 = &local_128;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_320,"Verify",&local_321);
    io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>&>
              (&local_128,(string *)local_320,&verify_function);
    local_322 = 0;
    local_70 = &local_298;
    local_68 = 3;
    v_00._M_len = 3;
    v_00._M_array = local_70;
    absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_60._M_local_buf,v_00);
    io::Printer::WithVars
              ((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
                *)local_50,p,(Span<const_google::protobuf::io::Printer::Sub>)local_60);
    local_3d0 = (Sub *)&local_70;
    do {
      local_3d0 = local_3d0 + -1;
      io::Printer::Sub::~Sub(local_3d0);
    } while (local_3d0 != &local_298);
    std::__cxx11::string::~string((string *)local_320);
    std::allocator<char>::~allocator(&local_321);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator(&local_2f9);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
    file = FieldDescriptor::file(field);
    FVar3 = GetOptimizeFor(file,options);
    local_323 = FVar3 == FileOptions_OptimizeMode_LITE_RUNTIME;
    cVar1 = google::protobuf::internal::cpp::GetUtf8CheckMode(field,(bool)local_323);
    if (cVar1 == '\0') {
      if ((v.storage_.callback_buffer_[0xf] & 1U) == 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_350,
                   "\n          $pbi$::WireFormatLite::$Strict$(\n              $params$ $pbi$::WireFormatLite::SERIALIZE, \"$pkg.Msg.field$\");\n        "
                  );
        io::Printer::SourceLocation::current();
        io::Printer::Emit(p,local_350._M_len,local_350._M_str);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_338,
                   "\n          DO_($pbi$::WireFormatLite::$Strict$(\n              $params$ $pbi$::WireFormatLite::PARSE, \"$pkg.Msg.field$\"));\n        "
                  );
        io::Printer::SourceLocation::current();
        io::Printer::Emit(p,local_338._M_len,local_338._M_str);
      }
    }
    else if (cVar1 == '\x01') {
      if ((v.storage_.callback_buffer_[0xf] & 1U) == 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_380,
                   "\n          $pbi$::WireFormat::$Verify$($params$ $pbi$::WireFormat::SERIALIZE,\n                                      \"$pkg.Msg.field$\");\n        "
                  );
        io::Printer::SourceLocation::current();
        io::Printer::Emit(p,local_380._M_len,local_380._M_str);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_368,
                   "\n          $pbi$::WireFormat::$Verify$($params$ $pbi$::WireFormat::PARSE,\n                                      \"$pkg.Msg.field$\");\n        "
                  );
        io::Printer::SourceLocation::current();
        io::Printer::Emit(p,local_368._M_len,local_368._M_str);
      }
    }
    absl::lts_20240722::
    Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
                *)local_50);
  }
  return;
}

Assistant:

static void GenerateUtf8CheckCode(io::Printer* p, const FieldDescriptor* field,
                                  const Options& options, bool for_parse,
                                  absl::string_view params,
                                  absl::string_view strict_function,
                                  absl::string_view verify_function) {
  if (field->type() != FieldDescriptor::TYPE_STRING) return;

  auto v = p->WithVars({
      {"params", params},
      {"Strict", strict_function},
      {"Verify", verify_function},
  });

  bool is_lite =
      GetOptimizeFor(field->file(), options) == FileOptions::LITE_RUNTIME;
  switch (internal::cpp::GetUtf8CheckMode(field, is_lite)) {
    case internal::cpp::Utf8CheckMode::kStrict:
      if (for_parse) {
        p->Emit(R"cc(
          DO_($pbi$::WireFormatLite::$Strict$(
              $params$ $pbi$::WireFormatLite::PARSE, "$pkg.Msg.field$"));
        )cc");
      } else {
        p->Emit(R"cc(
          $pbi$::WireFormatLite::$Strict$(
              $params$ $pbi$::WireFormatLite::SERIALIZE, "$pkg.Msg.field$");
        )cc");
      }
      break;

    case internal::cpp::Utf8CheckMode::kVerify:
      if (for_parse) {
        p->Emit(R"cc(
          $pbi$::WireFormat::$Verify$($params$ $pbi$::WireFormat::PARSE,
                                      "$pkg.Msg.field$");
        )cc");
      } else {
        p->Emit(R"cc(
          $pbi$::WireFormat::$Verify$($params$ $pbi$::WireFormat::SERIALIZE,
                                      "$pkg.Msg.field$");
        )cc");
      }
      break;

    case internal::cpp::Utf8CheckMode::kNone:
      break;
  }
}